

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O3

bool __thiscall apollonia::Arbiter::operator==(Arbiter *this,Arbiter *other)

{
  Body *pBVar1;
  Body *pBVar2;
  Body *pBVar3;
  bool bVar4;
  Body *b1;
  Body *pBVar5;
  Body *a2;
  Body *pBVar6;
  pointer pCVar7;
  ulong uVar8;
  long lVar9;
  
  pBVar1 = this->a_;
  pBVar6 = this->b_;
  pBVar2 = other->a_;
  pBVar3 = other->b_;
  pBVar5 = pBVar6;
  if (pBVar6 < pBVar1) {
    pBVar5 = pBVar1;
    pBVar1 = pBVar6;
  }
  pBVar6 = pBVar3;
  if (pBVar3 < pBVar2) {
    pBVar6 = pBVar2;
    pBVar2 = pBVar3;
  }
  if (pBVar2 == pBVar1 && pBVar6 == pBVar5) {
    pCVar7 = (this->contacts_).
             super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->contacts_).
        super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
        super__Vector_impl_data._M_finish == pCVar7) {
      bVar4 = true;
    }
    else {
      lVar9 = 0;
      uVar8 = 0;
      do {
        bVar4 = Contact::operator==((Contact *)
                                    ((long)&(((Contact *)(&pCVar7->from_a + -0xc))->position).x +
                                    lVar9),(Contact *)
                                           ((long)&(((Contact *)
                                                    (&((other->contacts_).
                                                                                                              
                                                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->from_a
                                                  + -0xc))->position).x + lVar9));
        if (!bVar4) {
          return bVar4;
        }
        uVar8 = uVar8 + 1;
        pCVar7 = (this->contacts_).
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x48;
      } while (uVar8 < (ulong)(((long)(this->contacts_).
                                      super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 3
                               ) * -0x71c71c71c71c71c7));
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Arbiter::operator==(const Arbiter& other) const {
  if (ArbiterKey(*this) != ArbiterKey(other)) {
    return false;
  }
  for (size_t i = 0; i < contacts_.size(); ++i) {
    if (contacts_[i] != other.contacts_[i]) {
      return false;
    }
  }
  return true;
}